

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O1

int vrna_file_exists(char *filename)

{
  int iVar1;
  stat buf;
  stat local_90;
  
  iVar1 = stat(filename,&local_90);
  return (int)(iVar1 == 0);
}

Assistant:

PUBLIC int
vrna_file_exists(const char *filename)
{
  int           r = 0;

#ifdef _WIN32
  struct _stat  buf;
  r = _stat(filename, &buf) == 0 ? 1 : 0;
#else
  struct stat   buf;
  r = stat(filename, &buf) == 0 ? 1 : 0;
#endif
  return r;
}